

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2latlng.cc
# Opt level: O2

void __thiscall S2LatLng::S2LatLng(S2LatLng *this,S2Point *p)

{
  ostream *os;
  S1Angle SVar1;
  S2LogMessage SStack_38;
  double local_28;
  
  local_28 = (double)Latitude(p);
  SVar1 = Longitude(p);
  (this->coords_).c_[0] = local_28;
  (this->coords_).c_[1] = SVar1.radians_;
  if ((1.5707963267948966 < ABS(local_28)) || (3.141592653589793 < ABS(SVar1.radians_))) {
    S2LogMessage::S2LogMessage
              (&SStack_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2latlng.cc"
               ,0x30,kError,(ostream *)&std::cerr);
    os = std::operator<<(SStack_38.stream_,"Invalid S2LatLng in constructor: ");
    ::operator<<(os,this);
    S2LogMessage::~S2LogMessage(&SStack_38);
  }
  return;
}

Assistant:

S2LatLng::S2LatLng(const S2Point& p)
  : coords_(Latitude(p).radians(), Longitude(p).radians()) {
  // The latitude and longitude are already normalized.
  S2_DLOG_IF(ERROR, !is_valid())
      << "Invalid S2LatLng in constructor: " << *this;
}